

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsFieldDescriptorGetFixedOrder
              (FmsFieldDescriptor fd,FmsFieldType *field_type,FmsBasisType *basis_type,FmsInt *order
              )

{
  _FmsFieldDescriptor_FixedOrder *p_Var1;
  _FmsFieldDescriptor_FixedOrder *fo;
  FmsInt *order_local;
  FmsBasisType *basis_type_local;
  FmsFieldType *field_type_local;
  FmsFieldDescriptor fd_local;
  int local_4;
  
  if (fd == (FmsFieldDescriptor)0x0) {
    local_4 = 1;
  }
  else {
    p_Var1 = (fd->descriptor).fixed_order;
    if (field_type != (FmsFieldType *)0x0) {
      *field_type = p_Var1->field_type;
    }
    if (basis_type != (FmsBasisType *)0x0) {
      *basis_type = p_Var1->basis_type;
    }
    if (order != (FmsInt *)0x0) {
      *order = p_Var1->order;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsFieldDescriptorGetFixedOrder(FmsFieldDescriptor fd,
                                    FmsFieldType *field_type,
                                    FmsBasisType *basis_type, FmsInt *order) {
  if (!fd) { E_RETURN(1); }
  struct _FmsFieldDescriptor_FixedOrder *fo = fd->descriptor.fixed_order;
  if (field_type) { *field_type = fo->field_type; }
  if (basis_type) { *basis_type = fo->basis_type; }
  if (order) { *order = fo->order; }
  return 0;
}